

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O2

void __thiscall
cbtIDebugDraw::drawAabb(cbtIDebugDraw *this,cbtVector3 *from,cbtVector3 *to,cbtVector3 *color)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  cbtVector3 cVar12;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  float local_80;
  float local_7c;
  undefined8 local_78;
  float local_70;
  undefined4 local_6c;
  undefined8 local_68;
  float local_60;
  undefined4 local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar9 = in_ZMM0._8_56_;
  cVar12 = ::operator-(to,from);
  auVar7._0_8_ = cVar12.m_floats._0_8_;
  auVar7._8_56_ = auVar9;
  auVar6._8_4_ = 0x3f000000;
  auVar6._0_8_ = 0x3f0000003f000000;
  auVar6._12_4_ = 0x3f000000;
  local_48 = vmulps_avx512vl(auVar7._0_16_,auVar6);
  local_7c = cVar12.m_floats[2] * 0.5;
  auVar9 = (undefined1  [56])0x0;
  cVar12 = ::operator+(to,from);
  auVar8._0_8_ = cVar12.m_floats._0_8_;
  auVar8._8_56_ = auVar9;
  auVar1._8_4_ = 0x3f000000;
  auVar1._0_8_ = 0x3f0000003f000000;
  auVar1._12_4_ = 0x3f000000;
  local_58 = vmulps_avx512vl(auVar8._0_16_,auVar1);
  _local_98 = _DAT_00f47d60;
  local_80 = cVar12.m_floats[2] * 0.5;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      local_5c = 0;
      local_6c = 0;
      auVar10._0_4_ = local_58._0_4_ + local_48._0_4_ * local_98._0_4_;
      auVar10._4_4_ = local_58._4_4_ + local_48._4_4_ * local_98._4_4_;
      auVar10._8_4_ = local_58._8_4_ + local_48._8_4_ * 0.0;
      auVar10._12_4_ = local_58._12_4_ + local_48._12_4_ * 0.0;
      local_68 = vmovlps_avx(auVar10);
      local_60 = local_80 + local_7c * (float)uStack_90;
      auVar2._8_4_ = 0x80000000;
      auVar2._0_8_ = 0x8000000080000000;
      auVar2._12_4_ = 0x80000000;
      auVar6 = vxorps_avx512vl(ZEXT416(*(uint *)(local_98 + lVar4 * 4)),auVar2);
      *(int *)(local_98 + lVar4 * 4) = auVar6._0_4_;
      local_70 = local_80 + local_7c * (float)uStack_90;
      auVar11._0_4_ = local_58._0_4_ + local_48._0_4_ * local_98._0_4_;
      auVar11._4_4_ = local_58._4_4_ + local_48._4_4_ * local_98._4_4_;
      auVar11._8_4_ = local_58._8_4_ + local_48._8_4_ * 0.0;
      auVar11._12_4_ = local_58._12_4_ + local_48._12_4_ * 0.0;
      local_78 = vmovlps_avx(auVar11);
      (*this->_vptr_cbtIDebugDraw[4])(this,&local_68,&local_78,color);
    }
    uStack_90 = 0xbf800000;
    local_98 = (undefined1  [8])0xbf800000bf800000;
    if (lVar5 != 3) {
      auVar3._8_4_ = 0x80000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._12_4_ = 0x80000000;
      auVar6 = vxorps_avx512vl(ZEXT416(*(uint *)(local_98 + lVar5 * 4)),auVar3);
      *(int *)(local_98 + lVar5 * 4) = auVar6._0_4_;
    }
  }
  return;
}

Assistant:

virtual void drawAabb(const cbtVector3& from, const cbtVector3& to, const cbtVector3& color)
	{
		cbtVector3 halfExtents = (to - from) * 0.5f;
		cbtVector3 center = (to + from) * 0.5f;
		int i, j;

		cbtVector3 edgecoord(1.f, 1.f, 1.f), pa, pb;
		for (i = 0; i < 4; i++)
		{
			for (j = 0; j < 3; j++)
			{
				pa = cbtVector3(edgecoord[0] * halfExtents[0], edgecoord[1] * halfExtents[1],
							   edgecoord[2] * halfExtents[2]);
				pa += center;

				int othercoord = j % 3;
				edgecoord[othercoord] *= -1.f;
				pb = cbtVector3(edgecoord[0] * halfExtents[0], edgecoord[1] * halfExtents[1],
							   edgecoord[2] * halfExtents[2]);
				pb += center;

				drawLine(pa, pb, color);
			}
			edgecoord = cbtVector3(-1.f, -1.f, -1.f);
			if (i < 3)
				edgecoord[i] *= -1.f;
		}
	}